

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

Variable *
soul::BlockBuilder::createVariable<soul::Identifier>
          (Module *m,Type *type,Identifier *name,Role role)

{
  Variable *pVVar1;
  Identifier local_40;
  CodeLocation local_38;
  Role local_24;
  Identifier *pIStack_20;
  Role role_local;
  Identifier *name_local;
  Type *type_local;
  Module *m_local;
  
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  local_24 = role;
  pIStack_20 = name;
  name_local = (Identifier *)type;
  type_local = (Type *)m;
  CodeLocation::CodeLocation(&local_38);
  local_40 = heart::Allocator::get<soul::Identifier>
                       (*(Allocator **)&type_local[0xc].boundingSize,pIStack_20);
  pVVar1 = Module::
           allocate<soul::heart::Variable,soul::CodeLocation,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
                     (m,&local_38,type,&local_40,&local_24);
  CodeLocation::~CodeLocation(&local_38);
  return pVVar1;
}

Assistant:

static heart::Variable& createVariable (Module& m, Type type, StringType&& name, heart::Variable::Role role)
    {
        return m.allocate<heart::Variable> (CodeLocation(), std::move (type), m.allocator.get (name), role);
    }